

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetSourceFilePaths
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  pointer *ppEVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  cmGeneratorTarget *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  TargetType TVar10;
  string *psVar11;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var12;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  cmLinkImplementationLibraries *pcVar14;
  long *plVar15;
  cmake *cmakeInstance;
  pointer *ppbVar16;
  cmFileSet *pcVar17;
  pointer pbVar18;
  size_type *psVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  _Alloc_hider _Var20;
  EmptyElements emptyElements;
  pointer item_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_02;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view value;
  cmBTStringRange cVar21;
  cmBTStringRange cVar22;
  cmList items;
  cmList cStack_290;
  bool local_278;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_270;
  string *local_268;
  pointer local_260;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  EvaluatedTargetPropertyEntries fileSetEntries;
  string genex;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_208;
  string local_200;
  cmListFileBacktrace local_1e0;
  cmListFileBacktrace local_1d0;
  long *local_1c0 [2];
  long local_1b0 [2];
  cmList debugProperties;
  EvaluatedTargetPropertyEntries linkObjectsEntries;
  cmGeneratorExpressionDAGChecker dagChecker;
  EvaluatedTargetPropertyEntries linkInterfaceSourcesEntries;
  string local_c0;
  cmGeneratorExpression ge;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueSrcs;
  EvaluatedTargetPropertyEntries entries;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_270 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
              __return_storage_ptr__;
  local_268 = config;
  if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
    cVar21 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
    _Var12 = cVar21.Begin._M_current;
    if (_Var12._M_current != cVar21.End._M_current._M_current) {
      do {
        pcVar2 = ((_Var12._M_current)->Value)._M_dataplus._M_p;
        dagChecker.Parent = (cmGeneratorExpressionDAGChecker *)&dagChecker.Property;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&dagChecker,pcVar2,
                   pcVar2 + ((_Var12._M_current)->Value)._M_string_length);
        init_00._M_len = 1;
        init_00._M_array = (iterator)&dagChecker;
        cmList::cmList(&items,init_00);
        __args = items.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = items.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (dagChecker.Parent != (cmGeneratorExpressionDAGChecker *)&dagChecker.Property) {
          operator_delete(dagChecker.Parent,(ulong)(dagChecker.Property._M_dataplus._M_p + 1));
          __args = items.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar4 = items.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; __args != pbVar4; __args = __args + 1) {
          dagChecker.Target = (cmGeneratorTarget *)(__args->_M_dataplus)._M_p;
          dagChecker.Parent = (cmGeneratorExpressionDAGChecker *)__args->_M_string_length;
          __str._M_str = "$<TARGET_OBJECTS:";
          __str._M_len = 0x11;
          iVar9 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)&dagChecker,0,0x11,
                             __str);
          if ((iVar9 != 0) || ((__args->_M_dataplus)._M_p[__args->_M_string_length - 1] != '>')) {
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string_const&>(local_270,__args);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&items.Values);
        _Var12._M_current = _Var12._M_current + 1;
      } while (_Var12._M_current != cVar21.End._M_current._M_current);
    }
  }
  else {
    this_00 = this->Makefile;
    ppbVar16 = &items.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    uniqueSrcs._M_h._M_buckets = (__buckets_ptr)0x1d;
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar16;
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)std::__cxx11::string::_M_create((ulong *)&items,(ulong)&uniqueSrcs);
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uniqueSrcs._M_h._M_buckets;
    builtin_strncpy((char *)((long)&(items.Values.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            5),"ARGET_PR",8);
    builtin_strncpy((char *)((long)&(items.Values.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->field_2 + 5),
                    "OPERTIES",8);
    ((items.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p = (pointer)0x45445f454b414d43;
    (items.Values.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length = 0x475241545f475542;
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)uniqueSrcs._M_h._M_buckets;
    *(undefined1 *)
     ((long)&((items.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
     (long)uniqueSrcs._M_h._M_buckets) = 0;
    psVar11 = (string *)cmMakefile::GetDefinition(this_00,(string *)&items);
    if (psVar11 == (string *)0x0) {
      psVar11 = &cmValue::Empty_abi_cxx11_;
    }
    pcVar2 = (psVar11->_M_dataplus)._M_p;
    dagChecker.Parent = (cmGeneratorExpressionDAGChecker *)&dagChecker.Property;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&dagChecker,pcVar2,pcVar2 + psVar11->_M_string_length);
    init._M_len = 1;
    init._M_array = (iterator)&dagChecker;
    cmList::cmList(&debugProperties,init);
    if (dagChecker.Parent != (cmGeneratorExpressionDAGChecker *)&dagChecker.Property) {
      operator_delete(dagChecker.Parent,(ulong)(dagChecker.Property._M_dataplus._M_p + 1));
    }
    if (items.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar16) {
      operator_delete(items.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((items.Values.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (this->DebugSourcesDone == false) {
      _Var13 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                         (debugProperties.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          debugProperties.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,"SOURCES");
      bVar8 = _Var13._M_current !=
              debugProperties.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar8 = false;
    }
    if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
      this->DebugSourcesDone = true;
    }
    local_c0.field_2._M_allocated_capacity._0_4_ = 0x52554f53;
    local_c0._M_string_length = 7;
    local_c0.field_2._M_allocated_capacity._4_4_ = 0x534543;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,this,&local_c0,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                               local_c0.field_2._M_allocated_capacity._0_4_) + 1);
    }
    ppbVar16 = &items.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)items.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar16;
    EvaluateTargetPropertyEntries
              (&entries,this,local_268,(string *)&items,&dagChecker,&this->SourceEntries);
    if (items.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar16) {
      operator_delete(items.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((items.Values.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    uniqueSrcs._M_h._M_buckets = &uniqueSrcs._M_h._M_single_bucket;
    uniqueSrcs._M_h._M_bucket_count = 1;
    uniqueSrcs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uniqueSrcs._M_h._M_element_count = 0;
    uniqueSrcs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    uniqueSrcs._M_h._M_rehash_policy._M_next_resize = 0;
    uniqueSrcs._M_h._M_single_bucket = (__node_base_ptr)0x0;
    bVar5 = anon_unknown.dwarf_28947b3::processSources
                      (this,&entries,
                       (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_270,&uniqueSrcs,bVar8);
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    linkInterfaceSourcesEntries._17_8_ = 0;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    linkInterfaceSourcesEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&items.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000011;
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)std::__cxx11::string::_M_create((ulong *)&items,(ulong)&fileSetEntries);
    ppEVar1 = &fileSetEntries.Entries.
               super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)fileSetEntries.Entries.
                  super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    ((items.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p = (pointer)0x4341465245544e49;
    (items.Values.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length = 0x454352554f535f45;
    ((items.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->field_2)._M_local_buf[0] = 'S';
    items.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)fileSetEntries.Entries.
                  super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    *(undefined1 *)
     ((long)&(fileSetEntries.Entries.
              super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_start)->LinkImplItem +
     (long)&(items.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus) = 0;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)ppEVar1;
    AddInterfaceEntries(this,local_268,(string *)&items,(string *)&fileSetEntries,&dagChecker,
                        &linkInterfaceSourcesEntries,No,Usage);
    if (fileSetEntries.Entries.
        super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppEVar1) {
      operator_delete(fileSetEntries.Entries.
                      super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      CONCAT71(fileSetEntries.Entries.
                               super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                               fileSetEntries.Entries.
                               super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
    }
    if (items.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&items.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(items.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((items.Values.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    bVar6 = anon_unknown.dwarf_28947b3::processSources
                      (this,&linkInterfaceSourcesEntries,
                       (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_270,&uniqueSrcs,bVar8);
    TVar10 = cmTarget::GetType(this->Target);
    if (TVar10 == OBJECT_LIBRARY) {
      bVar7 = false;
    }
    else {
      linkObjectsEntries.Entries.
      super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      linkObjectsEntries._17_8_ = 0;
      linkObjectsEntries.Entries.
      super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      linkObjectsEntries.Entries.
      super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      linkObjectsEntries.Entries.
      super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      pcVar14 = GetLinkImplementationLibrariesInternal(this,local_268,this,Usage);
      if (pcVar14 != (cmLinkImplementationLibraries *)0x0) {
        linkObjectsEntries.HadContextSensitiveCondition = pcVar14->HadContextSensitiveCondition;
        item_00 = (pcVar14->Libraries).
                  super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_260 = (pcVar14->Libraries).
                    super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        if (item_00 != local_260) {
          do {
            pcVar3 = (item_00->super_cmLinkItem).Target;
            if ((pcVar3 != (cmGeneratorTarget *)0x0) &&
               (TVar10 = cmTarget::GetType(pcVar3->Target), TVar10 == OBJECT_LIBRARY)) {
              cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
                        ((string *)&fileSetEntries,this->LocalGenerator->GlobalGenerator,
                         (item_00->super_cmLinkItem).Target);
              plVar15 = (long *)std::__cxx11::string::replace
                                          ((ulong)&fileSetEntries,0,(char *)0x0,0x945468);
              items.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&items.Values.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pbVar18 = (pointer)(plVar15 + 2);
              if ((pointer)*plVar15 == pbVar18) {
                items.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar18->_M_dataplus)._M_p;
                cStack_290.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar15[3];
              }
              else {
                items.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar18->_M_dataplus)._M_p;
                items.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar15;
              }
              items.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar15[1];
              *plVar15 = (long)pbVar18;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              plVar15 = (long *)std::__cxx11::string::append((char *)&items);
              psVar19 = (size_type *)(plVar15 + 2);
              if ((size_type *)*plVar15 == psVar19) {
                genex.field_2._M_allocated_capacity = *psVar19;
                genex.field_2._8_8_ = plVar15[3];
                genex._M_dataplus._M_p = (pointer)&genex.field_2;
              }
              else {
                genex.field_2._M_allocated_capacity = *psVar19;
                genex._M_dataplus._M_p = (pointer)*plVar15;
              }
              genex._M_string_length = plVar15[1];
              *plVar15 = (long)psVar19;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              if (items.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&items.Values.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(items.Values.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((items.Values.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + 1));
              }
              cmakeInstance = cmMakefile::GetCMakeInstance(this->Makefile);
              local_1d0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (item_00->super_cmLinkItem).Backtrace.
                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              local_1d0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (item_00->super_cmLinkItem).Backtrace.
                   super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
              if (local_1d0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_1d0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_use_count =
                       (local_1d0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                        TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_1d0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_use_count =
                       (local_1d0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                        TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              cmGeneratorExpression::cmGeneratorExpression(&ge,cmakeInstance,&local_1d0);
              if (local_1d0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1d0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                           TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              local_1c0[0] = local_1b0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1c0,genex._M_dataplus._M_p,
                         genex._M_dataplus._M_p + genex._M_string_length);
              cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
              if (local_1c0[0] != local_1b0) {
                operator_delete(local_1c0[0],local_1b0[0] + 1);
              }
              *(undefined1 *)
               ((long)cge._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
               0x49) = 1;
              local_1e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (item_00->super_cmLinkItem).Backtrace.
                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              local_1e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (item_00->super_cmLinkItem).Backtrace.
                   super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
              if (local_1e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_1e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_use_count =
                       (local_1e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                        TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_1e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_use_count =
                       (local_1e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                        TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              EvaluatedTargetPropertyEntry::EvaluatedTargetPropertyEntry
                        ((EvaluatedTargetPropertyEntry *)&items,item_00,&local_1e0);
              if (local_1e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1e0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                           TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
              local_200._M_string_length = 0;
              local_200.field_2._M_local_buf[0] = '\0';
              emptyElements = No;
              psVar11 = cmCompiledGeneratorExpression::Evaluate
                                  ((cmCompiledGeneratorExpression *)
                                   cge._M_t.
                                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                   _M_head_impl,this->LocalGenerator,local_268,this,&dagChecker,
                                   (cmGeneratorTarget *)0x0,&local_200);
              value._M_str = (char *)0x0;
              value._M_len = (size_t)(psVar11->_M_dataplus)._M_p;
              cmList::insert(&cStack_290,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)cStack_290.Values.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar11->_M_string_length,value,emptyElements);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._M_dataplus._M_p != &local_200.field_2) {
                operator_delete(local_200._M_dataplus._M_p,
                                CONCAT71(local_200.field_2._M_allocated_capacity._1_7_,
                                         local_200.field_2._M_local_buf[0]) + 1);
              }
              if (*(char *)((long)cge._M_t.
                                  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                  _M_head_impl + 0x130) == '\x01') {
                local_278 = true;
              }
              std::
              vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
              emplace_back<EvaluatedTargetPropertyEntry>
                        (&linkObjectsEntries.Entries,(EvaluatedTargetPropertyEntry *)&items);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&cStack_290.Values);
              if (items.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           items.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::~unique_ptr(&cge);
              cmGeneratorExpression::~cmGeneratorExpression(&ge);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)genex._M_dataplus._M_p != &genex.field_2) {
                operator_delete(genex._M_dataplus._M_p,genex.field_2._M_allocated_capacity + 1);
              }
              if (fileSetEntries.Entries.
                  super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&fileSetEntries.Entries.
                            super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(fileSetEntries.Entries.
                                super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                CONCAT71(fileSetEntries.Entries.
                                         super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                         fileSetEntries.Entries.
                                         super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) +
                                1);
              }
            }
            item_00 = item_00 + 1;
          } while (item_00 != local_260);
        }
      }
      bVar7 = anon_unknown.dwarf_28947b3::processSources
                        (this,&linkObjectsEntries,
                         (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_270,&uniqueSrcs,bVar8);
      std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
      ~vector(&linkObjectsEntries.Entries);
    }
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    fileSetEntries.HadContextSensitiveCondition = false;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    fileSetEntries.Entries.
    super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    cVar21 = cmTarget::GetHeaderSetsEntries_abi_cxx11_(this->Target);
    if (cVar21.Begin._M_current._M_current != cVar21.End._M_current._M_current) {
      do {
        local_208 = cVar21.End._M_current;
        local_260 = (pointer)cVar21.Begin._M_current;
        ppbVar16 = &items.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pcVar2 = (((cmLinkItem *)
                  &((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_260)->Value)->String)._M_dataplus._M_p;
        items.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar16;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&items,pcVar2,
                   pcVar2 + (((cmLinkItem *)
                             &((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_260)->Value)->String)._M_string_length);
        init_01._M_len = 1;
        init_01._M_array = (iterator)&items;
        cmList::cmList((cmList *)&genex,init_01);
        _Var20 = genex._M_dataplus;
        psVar11 = (string *)genex._M_string_length;
        if (items.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar16) {
          operator_delete(items.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((items.Values.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
          _Var20 = genex._M_dataplus;
          psVar11 = (string *)genex._M_string_length;
        }
        for (; (string *)_Var20._M_p != psVar11; _Var20._M_p = (pointer)((long)_Var20._M_p + 0x20))
        {
          pcVar17 = cmTarget::GetFileSet(this->Target,(string *)_Var20._M_p);
          anon_unknown.dwarf_28947b3::addFileSetEntry
                    (this,local_268,&dagChecker,pcVar17,&fileSetEntries);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&genex);
        psVar11 = &(local_260->super_cmLinkItem).Feature;
        cVar21.End._M_current = local_208._M_current;
        cVar21.Begin._M_current =
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )psVar11;
      } while ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar11 != local_208._M_current);
    }
    cVar22 = cmTarget::GetCxxModuleSetsEntries_abi_cxx11_(this->Target);
    if (cVar22.Begin._M_current._M_current != cVar22.End._M_current._M_current) {
      do {
        local_208 = cVar22.End._M_current;
        local_260 = (pointer)cVar22.Begin._M_current;
        ppbVar16 = &items.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pcVar2 = (((cmLinkItem *)
                  &((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_260)->Value)->String)._M_dataplus._M_p;
        items.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar16;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&items,pcVar2,
                   pcVar2 + (((cmLinkItem *)
                             &((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_260)->Value)->String)._M_string_length);
        init_02._M_len = 1;
        init_02._M_array = (iterator)&items;
        cmList::cmList((cmList *)&genex,init_02);
        _Var20 = genex._M_dataplus;
        psVar11 = (string *)genex._M_string_length;
        if (items.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar16) {
          operator_delete(items.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((items.Values.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
          _Var20 = genex._M_dataplus;
          psVar11 = (string *)genex._M_string_length;
        }
        for (; (string *)_Var20._M_p != psVar11; _Var20._M_p = (pointer)((long)_Var20._M_p + 0x20))
        {
          pcVar17 = cmTarget::GetFileSet(this->Target,(string *)_Var20._M_p);
          anon_unknown.dwarf_28947b3::addFileSetEntry
                    (this,local_268,&dagChecker,pcVar17,&fileSetEntries);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&genex);
        psVar11 = &(local_260->super_cmLinkItem).Feature;
        cVar22.End._M_current = local_208._M_current;
        cVar22.Begin._M_current =
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )psVar11;
      } while ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar11 != local_208._M_current);
    }
    bVar8 = anon_unknown.dwarf_28947b3::processSources
                      (this,&fileSetEntries,
                       (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_270,&uniqueSrcs,bVar8);
    this->SourcesAreContextDependent = (uint)(byte)((bVar5 || bVar6) | bVar7 | bVar8);
    std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
    ~vector(&fileSetEntries.Entries);
    std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
    ~vector(&linkInterfaceSourcesEntries.Entries);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&uniqueSrcs._M_h);
    std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
    ~vector(&entries.Entries);
    if (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&dagChecker.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
      operator_delete(dagChecker.Property._M_dataplus._M_p,
                      dagChecker.Property.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&debugProperties.Values);
  }
  return (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_270;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetSourceFilePaths(
  std::string const& config) const
{
  std::vector<BT<std::string>> files;

  if (!this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    // At configure-time, this method can be called as part of getting the
    // LOCATION property or to export() a file to be include()d.  However
    // there is no cmGeneratorTarget at configure-time, so search the SOURCES
    // for TARGET_OBJECTS instead for backwards compatibility with OLD
    // behavior of CMP0024 and CMP0026 only.

    cmBTStringRange sourceEntries = this->Target->GetSourceEntries();
    for (auto const& entry : sourceEntries) {
      cmList items{ entry.Value };
      for (auto const& item : items) {
        if (cmHasLiteralPrefix(item, "$<TARGET_OBJECTS:") &&
            item.back() == '>') {
          continue;
        }
        files.emplace_back(item);
      }
    }
    return files;
  }

  cmList debugProperties{ this->Makefile->GetDefinition(
    "CMAKE_DEBUG_TARGET_PROPERTIES") };
  bool debugSources =
    !this->DebugSourcesDone && cm::contains(debugProperties, "SOURCES");

  if (this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    this->DebugSourcesDone = true;
  }

  cmGeneratorExpressionDAGChecker dagChecker(this, "SOURCES", nullptr,
                                             nullptr);

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, std::string(), &dagChecker, this->SourceEntries);

  std::unordered_set<std::string> uniqueSrcs;
  bool contextDependentDirectSources =
    processSources(this, entries, files, uniqueSrcs, debugSources);

  // Collect INTERFACE_SOURCES of all direct link-dependencies.
  EvaluatedTargetPropertyEntries linkInterfaceSourcesEntries;
  AddInterfaceEntries(this, config, "INTERFACE_SOURCES", std::string(),
                      &dagChecker, linkInterfaceSourcesEntries,
                      IncludeRuntimeInterface::No, LinkInterfaceFor::Usage);
  bool contextDependentInterfaceSources = processSources(
    this, linkInterfaceSourcesEntries, files, uniqueSrcs, debugSources);

  // Collect TARGET_OBJECTS of direct object link-dependencies.
  bool contextDependentObjects = false;
  if (this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    EvaluatedTargetPropertyEntries linkObjectsEntries;
    AddObjectEntries(this, config, &dagChecker, linkObjectsEntries);
    contextDependentObjects = processSources(this, linkObjectsEntries, files,
                                             uniqueSrcs, debugSources);
    // Note that for imported targets or multi-config generators supporting
    // cross-config builds the paths to the object files must be per-config,
    // so contextDependentObjects will be true here even if object libraries
    // are specified without per-config generator expressions.
  }

  // Collect this target's file sets.
  EvaluatedTargetPropertyEntries fileSetEntries;
  AddFileSetEntries(this, config, &dagChecker, fileSetEntries);
  bool contextDependentFileSets =
    processSources(this, fileSetEntries, files, uniqueSrcs, debugSources);

  // Determine if sources are context-dependent or not.
  if (!contextDependentDirectSources && !contextDependentInterfaceSources &&
      !contextDependentObjects && !contextDependentFileSets) {
    this->SourcesAreContextDependent = Tribool::False;
  } else {
    this->SourcesAreContextDependent = Tribool::True;
  }

  return files;
}